

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  complex<double> *pcVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  lVar3 = destinationindex->fNElements;
  if (0 < lVar3) {
    lVar14 = 0;
    do {
      iVar8 = Local(this,destinationindex->fStore[lVar14]);
      lVar11 = (long)iVar8;
      lVar13 = lVar14;
      do {
        iVar8 = Local(this,destinationindex->fStore[lVar13]);
        lVar4 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar4 <= lVar14) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar13)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar9 = (long)iVar8;
        lVar12 = lVar9;
        if (lVar9 < lVar11) {
          lVar12 = lVar11;
        }
        if (lVar11 < lVar9) {
          lVar9 = lVar11;
        }
        lVar12 = (lVar12 + 1) * lVar12;
        uVar10 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
        pcVar5 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar6 = *(double *)(elmat->fElem[lVar4 * lVar13 + lVar14]._M_value + 8);
        pdVar1 = (double *)(pcVar5[lVar9]._M_value + uVar10 * 8);
        dVar7 = pdVar1[1];
        pdVar2 = (double *)(pcVar5[lVar9]._M_value + uVar10 * 8);
        *pdVar2 = *pdVar1 + *(double *)elmat->fElem[lVar4 * lVar13 + lVar14]._M_value;
        pdVar2[1] = dVar7 + dVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < lVar3);
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}